

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

Message * __thiscall
google::protobuf::Reflection::ReleaseMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  int iVar1;
  Message *pMVar2;
  ulong uVar3;
  undefined4 extraout_var;
  Message *pMVar4;
  
  pMVar2 = UnsafeArenaReleaseMessage(this,message,field,factory);
  uVar3 = *(ulong *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                    (ulong)(uint)(this->schema_).metadata_offset_);
  if ((uVar3 & 1) != 0) {
    uVar3 = *(ulong *)((uVar3 & 0xfffffffffffffffe) + 0x18);
  }
  pMVar4 = pMVar2;
  if ((pMVar2 != (Message *)0x0) && (uVar3 != 0)) {
    iVar1 = (*(pMVar2->super_MessageLite)._vptr_MessageLite[3])(pMVar2);
    pMVar4 = (Message *)CONCAT44(extraout_var,iVar1);
    (*(pMVar4->super_MessageLite)._vptr_MessageLite[0x10])(pMVar4,pMVar2);
  }
  return pMVar4;
}

Assistant:

Message* Reflection::ReleaseMessage(Message* message,
                                    const FieldDescriptor* field,
                                    MessageFactory* factory) const {
  Message* released = UnsafeArenaReleaseMessage(message, field, factory);
  if (GetArena(message) != nullptr && released != nullptr) {
    Message* copy_from_arena = released->New();
    copy_from_arena->CopyFrom(*released);
    released = copy_from_arena;
  }
  return released;
}